

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

LoopHeader * __thiscall Js::FunctionBody::GetLoopHeaderWithLock(FunctionBody *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  void *pvVar4;
  undefined4 *puVar5;
  
  pvVar4 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,LoopHeaderArray);
  if (pvVar4 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b28,"(this->GetLoopHeaderArrayWithLock() != nullptr)",
                                "this->GetLoopHeaderArrayWithLock() != nullptr");
    if (!bVar2) goto LAB_00768ae4;
    *puVar5 = 0;
  }
  uVar3 = GetCountField(this,LoopCount);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b29,"(index < GetLoopCount())","index < GetLoopCount()");
    if (!bVar2) {
LAB_00768ae4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pvVar4 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,LoopHeaderArray);
  return (LoopHeader *)((long)pvVar4 + (ulong)index * 0x30);
}

Assistant:

LoopHeader *FunctionBody::GetLoopHeaderWithLock(uint index) const
    {
        Assert(this->GetLoopHeaderArrayWithLock() != nullptr);
        Assert(index < GetLoopCount());
        return &this->GetLoopHeaderArrayWithLock()[index];
    }